

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O1

void __thiscall Assimp::ColladaParser::ReadGeometryLibrary(ColladaParser *this)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Mesh *pMesh;
  long lVar5;
  mapped_type *ppMVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  string id;
  allocator<char> local_59;
  key_type local_58;
  MeshLibrary *local_38;
  
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if (((char)iVar2 == '\0') &&
     (iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])(), (char)iVar2 != '\0')) {
    local_38 = &this->mMeshLibrary;
    do {
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar2 == 1) {
        if (iVar3 != 1) {
          __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Collada/ColladaParser.h"
                        ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"geometry");
        if (iVar2 == 0) {
          uVar4 = GetAttribute(this,"id");
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar4);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_58,(char *)CONCAT44(extraout_var_00,iVar2),&local_59);
          pMesh = (Mesh *)operator_new(0x2a0);
          (pMesh->mName)._M_dataplus._M_p = (pointer)&(pMesh->mName).field_2;
          (pMesh->mName)._M_string_length = 0;
          (pMesh->mName).field_2._M_local_buf[0] = '\0';
          (pMesh->mVertexID)._M_dataplus._M_p = (pointer)&(pMesh->mVertexID).field_2;
          (pMesh->mVertexID)._M_string_length = 0;
          (pMesh->mVertexID).field_2._M_local_buf[0] = '\0';
          (pMesh->mFaceSize).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pMesh->mFaceSize).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (pMesh->mFaceSize).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (pMesh->mFacePosIndices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pMesh->mFacePosIndices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (pMesh->mFacePosIndices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (pMesh->mSubMeshes).
          super__Vector_base<Assimp::Collada::SubMesh,_std::allocator<Assimp::Collada::SubMesh>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pMesh->mSubMeshes).
          super__Vector_base<Assimp::Collada::SubMesh,_std::allocator<Assimp::Collada::SubMesh>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (pMesh->mSubMeshes).
          super__Vector_base<Assimp::Collada::SubMesh,_std::allocator<Assimp::Collada::SubMesh>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          memset(&pMesh->mPerVertexData,0,0x1f8);
          lVar5 = 0x8e;
          do {
            *(undefined4 *)((long)&(pMesh->mName)._M_dataplus._M_p + lVar5 * 4) = 2;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 0x96);
          ppMVar6 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Mesh_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Mesh_*>_>_>
                    ::operator[](local_38,&local_58);
          *ppMVar6 = pMesh;
          iVar2 = TestAttribute(this,"name");
          if (iVar2 != -1) {
            iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])();
            pcVar1 = (char *)(pMesh->mName)._M_string_length;
            strlen((char *)CONCAT44(extraout_var_01,iVar2));
            std::__cxx11::string::_M_replace((ulong)pMesh,0,pcVar1,CONCAT44(extraout_var_01,iVar2));
          }
          ReadGeometry(this,pMesh);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          SkipElement(this);
        }
      }
      else if (iVar3 == 2) {
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar2 = strcmp((char *)CONCAT44(extraout_var_02,iVar2),"library_geometries");
        if (iVar2 == 0) {
          return;
        }
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,"Expected end of <library_geometries> element.","");
        ThrowException(this,&local_58);
      }
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar2 != '\0');
  }
  return;
}

Assistant:

void ColladaParser::ReadGeometryLibrary()
{
    if (mReader->isEmptyElement())
        return;

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("geometry"))
            {
                // read ID. Another entry which is "optional" by design but obligatory in reality
                int indexID = GetAttribute("id");
                std::string id = mReader->getAttributeValue(indexID);

                // TODO: (thom) support SIDs
                // ai_assert( TestAttribute( "sid") == -1);

                // create a mesh and store it in the library under its ID
                Mesh* mesh = new Mesh;
                mMeshLibrary[id] = mesh;

                // read the mesh name if it exists
                const int nameIndex = TestAttribute("name");
                if (nameIndex != -1)
                {
                    mesh->mName = mReader->getAttributeValue(nameIndex);
                }

                // read on from there
                ReadGeometry(mesh);
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "library_geometries") != 0)
                ThrowException("Expected end of <library_geometries> element.");

            break;
        }
    }
}